

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

boolean chest_trap(obj *obj,int bodypart,boolean disarm)

{
  xchar x;
  xchar y;
  obj *poVar1;
  uint uVar2;
  level *lev;
  boolean bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  char *local_100;
  int local_c0;
  int local_bc;
  int local_b0;
  int dmg;
  xchar oy;
  xchar ox;
  boolean insider;
  boolean costly;
  long loss;
  monst *shkp;
  char *pcStack_90;
  coord cc;
  char *msg;
  char buf [80];
  obj *otmp2;
  obj *otmp;
  boolean disarm_local;
  int bodypart_local;
  obj *obj_local;
  
  bVar3 = get_obj_location(obj,(xchar *)((long)&shkp + 6),(xchar *)((long)&shkp + 7),0);
  if (bVar3 != '\0') {
    obj->ox = shkp._6_1_;
    obj->oy = shkp._7_1_;
  }
  *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffff7fff;
  pcVar7 = "You trigger a trap!";
  if (disarm != '\0') {
    pcVar7 = "You set it off!";
  }
  pline(pcVar7);
  (*windowprocs.win_pause)(P_MESSAGE);
  if (((int)u.uluck + (int)u.moreluck < -0xc) ||
     (iVar5 = rn2((int)u.uluck + (int)u.moreluck + 0xd), iVar5 < 8)) {
    iVar5 = rn2(0x14);
    if (iVar5 == 0) {
      local_c0 = rn2(0x1a);
    }
    else {
      if ((int)u.uluck + (int)u.moreluck < 0xd) {
        local_bc = rn2(0xd - ((int)u.uluck + (int)u.moreluck));
      }
      else {
        local_bc = 0;
      }
      local_c0 = local_bc;
    }
    switch(local_c0) {
    case 0:
    case 1:
    case 2:
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        local_100 = rndcolor();
      }
      else {
        iVar5 = rn2(6);
        local_100 = blindgas[iVar5];
      }
      pcVar7 = xname(obj);
      pcVar7 = the(pcVar7);
      pline("A cloud of %s gas billows from %s.",local_100,pcVar7);
      if (((u.uprops[0x1b].intrinsic == 0) && (u.umonnum != 0x9e)) &&
         ((youmonst.data)->mlet != '\x1c')) {
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            stagger(youmonst.data,"stagger");
            pline("You %s and your vision blurs...");
          }
          else {
            stagger(youmonst.data,"stagger");
            pline("You %s and get dizzy...");
          }
        }
        else {
          pline("What a groovy feeling!");
        }
      }
      uVar2 = u.uprops[0x1b].intrinsic;
      iVar5 = rn2(7);
      make_stunned((ulong)(uVar2 + iVar5 + 0x10),'\0');
      uVar2 = u.uprops[0x23].intrinsic;
      iVar5 = rn2(5);
      make_hallucinated((ulong)(uVar2 + iVar5 + 0x10),'\0',0);
      break;
    case 3:
    case 4:
    case 5:
      if (u.uprops[0x38].extrinsic == 0) {
        pline("Suddenly you are frozen in place!");
        iVar5 = dice(5,6);
        nomul(-iVar5,"frozen by a trap");
        exercise(3,'\0');
        nomovemsg = "You can move again.";
      }
      else {
        pline("You momentarily stiffen.");
      }
      break;
    case 6:
    case 7:
    case 8:
      pline("You are jolted by a surge of electricity!");
      if ((((u.uprops[5].intrinsic == 0) && (u.uprops[5].extrinsic == 0)) &&
          ((youmonst.mintrinsics & 0x10) == 0)) ||
         ((((u.uprops[5].intrinsic & 0x4000000) != 0 && ((u.uprops[5].intrinsic & 0xfbffffff) == 0))
          && ((u.uprops[5].extrinsic == 0 && ((youmonst.mintrinsics & 0x10) == 0)))))) {
        if ((((u.uprops[5].intrinsic & 0x4000000) == 0) ||
            ((u.uprops[5].intrinsic & 0xfbffffff) != 0)) ||
           ((u.uprops[5].extrinsic != 0 || ((youmonst.mintrinsics & 0x10) != 0)))) {
          local_b0 = dice(4,4);
        }
        else {
          shieldeff(u.ux,u.uy);
          local_b0 = dice(2,4);
        }
      }
      else {
        shieldeff(u.ux,u.uy);
        pline("You don\'t seem to be affected.");
        local_b0 = 0;
      }
      destroy_item(0xb,6);
      if (local_b0 != 0) {
        losehp(local_b0,"electric shock",0);
      }
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      dofiretrap(obj);
      break;
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
      pcVar7 = body_part(bodypart);
      pline("You feel a needle prick your %s.",pcVar7);
      poisoned("needle",4,"poisoned needle",10);
      exercise(4,'\0');
      break;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
      pcVar7 = xname(obj);
      the(pcVar7);
      pline("A cloud of noxious gas billows from %s.");
      poisoned("gas cloud",0,"cloud of poison gas",0xf);
      exercise(4,'\0');
      break;
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      loss = 0;
      _dmg = 0;
      x = obj->ox;
      y = obj->oy;
      bVar3 = costly_spot(x,y);
      lev = level;
      bVar8 = false;
      if (bVar3 != '\0') {
        pcVar7 = in_rooms(level,x,y,0x12);
        loss = (long)shop_keeper(lev,*pcVar7);
        bVar8 = (monst *)loss != (monst *)0x0;
      }
      bVar9 = false;
      if (u.ushops[0] != '\0') {
        cVar4 = inside_shop(level,u.ux,u.uy);
        bVar9 = false;
        if (cVar4 != '\0') {
          pcVar7 = in_rooms(level,x,y,0x12);
          bVar9 = *pcVar7 == u.ushops[0];
        }
      }
      pcVar7 = Tobjnam(obj,"explode");
      pline("%s!",pcVar7);
      pcVar7 = xname(obj);
      sprintf((char *)&msg,"exploding %s",pcVar7);
      if (bVar8) {
        _dmg = stolen_value(obj,x,y,(byte)(*(uint *)(loss + 0x60) >> 0x16) & 1,'\x01');
      }
      delete_contents(obj);
      if (((uball != (obj *)0x0) && (uball->where != '\x03')) &&
         (((uchain->ox == u.ux && (uchain->oy == u.uy)) ||
          ((uball->ox == u.ux && (uball->oy == u.uy)))))) {
        unpunish();
      }
      otmp2 = level->objects[u.ux][u.uy];
      while (otmp2 != (obj *)0x0) {
        poVar1 = (otmp2->v).v_nexthere;
        if (bVar8) {
          lVar6 = stolen_value(otmp2,otmp2->ox,otmp2->oy,(byte)(*(uint *)(loss + 0x60) >> 0x16) & 1,
                               '\x01');
          _dmg = lVar6 + _dmg;
        }
        delobj(otmp2);
        otmp2 = poVar1;
      }
      wake_nearby();
      iVar5 = dice(6,6);
      losehp(iVar5,(char *)&msg,0);
      exercise(0,'\0');
      if ((bVar8) && (_dmg != 0)) {
        if (bVar9) {
          pcVar7 = currency(_dmg);
          pline("You owe %ld %s for objects destroyed.",_dmg,pcVar7);
        }
        else {
          pcVar7 = currency(_dmg);
          pline("You caused %ld %s worth of damage!",_dmg,pcVar7);
          make_angry_shk((monst *)loss,x,y);
        }
      }
      return '\x01';
    default:
      warning("bad chest trap");
    }
    bot();
  }
  else {
    iVar5 = rn2(0xd);
    switch(iVar5) {
    case 0:
    case 1:
    case 2:
    case 3:
      pcStack_90 = "gas cloud blows away";
      break;
    case 4:
    case 5:
    case 6:
      pcStack_90 = "poisoned needle misses";
      break;
    case 7:
    case 8:
      pcStack_90 = "flame fizzles out";
      break;
    case 9:
    case 10:
      pcStack_90 = "electric charge is grounded";
      break;
    case 0xb:
    case 0xc:
      pcStack_90 = "explosive charge is a dud";
      break;
    default:
      warning("chest disarm bug");
      pcStack_90 = (char *)0x0;
    }
    if (pcStack_90 != (char *)0x0) {
      pline("But luckily the %s!",pcStack_90);
    }
  }
  return '\0';
}

Assistant:

boolean chest_trap(struct obj *obj, int bodypart, boolean disarm)
{
	struct obj *otmp = obj, *otmp2;
	char	buf[80];
	const char *msg;
	coord cc;

	if (get_obj_location(obj, &cc.x, &cc.y, 0))	/* might be carried */
	    obj->ox = cc.x,  obj->oy = cc.y;

	otmp->otrapped = 0;	/* trap is one-shot; clear flag first in case
				   chest kills you and ends up in bones file */
	pline(disarm ? "You set it off!" : "You trigger a trap!");
	win_pause_output(P_MESSAGE);
	if (Luck > -13 && rn2(13+Luck) > 7) {	/* saved by luck */
	    /* trap went off, but good luck prevents damage */
	    switch (rn2(13)) {
		case 12:
		case 11:  msg = "explosive charge is a dud";  break;
		case 10:
		case  9:  msg = "electric charge is grounded";  break;
		case  8:
		case  7:  msg = "flame fizzles out";  break;
		case  6:
		case  5:
		case  4:  msg = "poisoned needle misses";  break;
		case  3:
		case  2:
		case  1:
		case  0:  msg = "gas cloud blows away";  break;
		default:  warning("chest disarm bug");  msg = NULL;
			  break;
	    }
	    if (msg) pline("But luckily the %s!", msg);
	} else {
	    switch(rn2(20) ? ((Luck >= 13) ? 0 : rn2(13-Luck)) : rn2(26)) {
		case 25:
		case 24:
		case 23:
		case 22:
		case 21: {
			  struct monst *shkp = 0;
			  long loss = 0L;
			  boolean costly, insider;
			  xchar ox = obj->ox, oy = obj->oy;

			  /* the obj location need not be that of player */
			  costly = (costly_spot(ox, oy) &&
				   (shkp = shop_keeper(level, *in_rooms(level, ox, oy,
				    SHOPBASE))) != NULL);
			  insider = (*u.ushops && inside_shop(level, u.ux, u.uy) &&
				    *in_rooms(level, ox, oy, SHOPBASE) == *u.ushops);

			  pline("%s!", Tobjnam(obj, "explode"));
			  sprintf(buf, "exploding %s", xname(obj));

			  if (costly)
			      loss += stolen_value(obj, ox, oy,
						(boolean)shkp->mpeaceful, TRUE);
			  delete_contents(obj);
			  /* we're about to delete all things at this location,
			   * which could include the ball & chain.
			   * If we attempt to call unpunish() in the
			   * for-loop below we can end up with otmp2
			   * being invalid once the chain is gone.
			   * Deal with ball & chain right now instead.
			   */
			  if (Punished && !carried(uball) &&
				((uchain->ox == u.ux && uchain->oy == u.uy) ||
				 (uball->ox == u.ux && uball->oy == u.uy)))
				unpunish();

			  for (otmp = level->objects[u.ux][u.uy];
							otmp; otmp = otmp2) {
			      otmp2 = otmp->nexthere;
			      if (costly)
				  loss += stolen_value(otmp, otmp->ox,
					  otmp->oy, (boolean)shkp->mpeaceful,
					  TRUE);
			      delobj(otmp);
			  }
			  wake_nearby();
			  losehp(dice(6,6), buf, KILLED_BY_AN);
			  exercise(A_STR, FALSE);
			  if (costly && loss) {
			      if (insider)
			      pline("You owe %ld %s for objects destroyed.",
							loss, currency(loss));
			      else {
				  pline("You caused %ld %s worth of damage!",
							loss, currency(loss));
				  make_angry_shk(shkp, ox, oy);
			      }
			  }
			  return TRUE;
			}
		case 20:
		case 19:
		case 18:
		case 17:
			pline("A cloud of noxious gas billows from %s.",
							the(xname(obj)));
			poisoned("gas cloud", A_STR, "cloud of poison gas",15);
			exercise(A_CON, FALSE);
			break;
		case 16:
		case 15:
		case 14:
		case 13:
			pline("You feel a needle prick your %s.",body_part(bodypart));
			poisoned("needle", A_CON, "poisoned needle",10);
			exercise(A_CON, FALSE);
			break;
		case 12:
		case 11:
		case 10:
		case 9:
			dofiretrap(obj);
			break;
		case 8:
		case 7:
		case 6: {
			int dmg;

			pline("You are jolted by a surge of electricity!");
			if (FShock_resistance)  {
			    shieldeff(u.ux, u.uy);
			    pline("You don't seem to be affected.");
			    dmg = 0;
			} else if (PShock_resistance) {
			    shieldeff(u.ux, u.uy);
			    dmg = dice(2, 4);
			} else {
			    dmg = dice(4, 4);
			}
			destroy_item(WAND_CLASS, AD_ELEC);
			if (dmg) losehp(dmg, "electric shock", KILLED_BY_AN);
			break;
		      }
		case 5:
		case 4:
		case 3:
			if (!Free_action) {                        
			pline("Suddenly you are frozen in place!");
			nomul(-dice(5, 6), "frozen by a trap");
			exercise(A_DEX, FALSE);
			nomovemsg = "You can move again.";
			} else pline("You momentarily stiffen.");
			break;
		case 2:
		case 1:
		case 0:
			pline("A cloud of %s gas billows from %s.",
				Blind ? blindgas[rn2(SIZE(blindgas))] :
				rndcolor(), the(xname(obj)));
			if (!Stunned) {
			    if (Hallucination)
				pline("What a groovy feeling!");
			    else if (Blind)
				pline("You %s and get dizzy...",
				    stagger(youmonst.data, "stagger"));
			    else
				pline("You %s and your vision blurs...",
				    stagger(youmonst.data, "stagger"));
			}
			make_stunned(HStun + rn1(7, 16),FALSE);
			make_hallucinated(HHallucination + rn1(5, 16),FALSE,0L);
			break;
		default: warning("bad chest trap");
			break;
	    }
	    bot();			/* to get immediate botl re-display */
	}

	return FALSE;
}